

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationCurveOccurrence::~IfcAnnotationCurveOccurrence
          (IfcAnnotationCurveOccurrence *this)

{
  void *pvVar1;
  char *pcVar2;
  long lVar3;
  void *pvVar4;
  
  lVar3 = *(long *)(*(long *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem + -0x18);
  pvVar1 = &(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x0 + lVar3;
  pcVar2 = (this->super_IfcAnnotationOccurrence).super_IfcStyledItem.Name.ptr.field_2._M_local_buf +
           lVar3;
  pcVar2[-0x58] = '8';
  pcVar2[-0x57] = -0x73;
  pcVar2[-0x56] = -0x75;
  pcVar2[-0x55] = '\0';
  pcVar2[-0x54] = '\0';
  pcVar2[-0x53] = '\0';
  pcVar2[-0x52] = '\0';
  pcVar2[-0x51] = '\0';
  pcVar2[0x38] = -0x78;
  pcVar2[0x39] = -0x73;
  pcVar2[0x3a] = -0x75;
  pcVar2[0x3b] = '\0';
  pcVar2[0x3c] = '\0';
  pcVar2[0x3d] = '\0';
  pcVar2[0x3e] = '\0';
  pcVar2[0x3f] = '\0';
  pcVar2[-0x48] = '`';
  pcVar2[-0x47] = -0x73;
  pcVar2[-0x46] = -0x75;
  pcVar2[-0x45] = '\0';
  pcVar2[-0x44] = '\0';
  pcVar2[-0x43] = '\0';
  pcVar2[-0x42] = '\0';
  pcVar2[-0x41] = '\0';
  if (*(char **)(pcVar2 + -0x10) != pcVar2) {
    operator_delete(*(char **)(pcVar2 + -0x10));
  }
  pvVar4 = *(void **)((long)pvVar1 + 0x30);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4);
  }
  operator_delete(pvVar1);
  return;
}

Assistant:

IfcAnnotationCurveOccurrence() : Object("IfcAnnotationCurveOccurrence") {}